

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wasm_tabletype_t,_std::default_delete<wasm_tabletype_t>_> __thiscall
wabt::MakeUnique<wasm_tabletype_t,wabt::interp::TableType&>(wabt *this,TableType *args)

{
  undefined8 uVar1;
  wasm_tabletype_t *this_00;
  TableType local_40;
  
  this_00 = (wasm_tabletype_t *)operator_new(0x20);
  local_40.super_ExternType.kind = (args->super_ExternType).kind;
  local_40.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_001f08e0;
  local_40.limits._12_6_ = SUB86((ulong)*(undefined8 *)((long)&(args->limits).max + 2) >> 0x10,0);
  local_40._12_8_ = *(undefined8 *)&(args->super_ExternType).field_0xc;
  uVar1 = *(undefined8 *)((long)&(args->limits).initial + 4);
  local_40.limits._4_6_ = SUB86(uVar1,0);
  local_40.limits.max._2_2_ = (undefined2)((ulong)uVar1 >> 0x30);
  wasm_tabletype_t::wasm_tabletype_t(this_00,&local_40);
  *(wasm_tabletype_t **)this = this_00;
  return (__uniq_ptr_data<wasm_tabletype_t,_std::default_delete<wasm_tabletype_t>,_true,_true>)
         (__uniq_ptr_data<wasm_tabletype_t,_std::default_delete<wasm_tabletype_t>,_true,_true>)this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}